

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.cpp
# Opt level: O3

int __thiscall ncnn::RNN::load_param(RNN *this,ParamDict *pd)

{
  int iVar1;
  
  iVar1 = ParamDict::get(pd,0,0);
  this->num_output = iVar1;
  iVar1 = ParamDict::get(pd,1,0);
  this->weight_data_size = iVar1;
  iVar1 = ParamDict::get(pd,2,0);
  this->direction = iVar1;
  iVar1 = ParamDict::get(pd,8,0);
  this->int8_scale_term = iVar1;
  return 0;
}

Assistant:

int RNN::load_param(const ParamDict& pd)
{
    num_output = pd.get(0, 0);
    weight_data_size = pd.get(1, 0);
    direction = pd.get(2, 0);
    int8_scale_term = pd.get(8, 0);

    if (int8_scale_term)
    {
#if !NCNN_INT8
        NCNN_LOGE("please build ncnn with NCNN_INT8 enabled for int8 inference");
        return -1;
#endif
    }

    return 0;
}